

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
              *this,int i)

{
  value_type *pvVar1;
  int i_00;
  
  FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
  ::fastAccessDx(*(value_type **)__return_storage_ptr__,
                 (FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
                  *)this,i);
  pvVar1 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
           ::fastAccessDx(*(value_type **)((long)__return_storage_ptr__ + 8),
                          (FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
                           *)((ulong)this & 0xffffffff),i_00);
  return pvVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}